

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.cpp
# Opt level: O0

void __thiscall
CVmObjCharSet::restore_from_file
          (CVmObjCharSet *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *param_4)

{
  uint uVar1;
  CVmFile *this_00;
  long in_RDX;
  CVmFile *in_RDI;
  size_t read_len;
  size_t len;
  char buf [128];
  CVmFile *buf_00;
  char *in_stack_ffffffffffffff58;
  CVmObjCharSet *in_stack_ffffffffffffff60;
  
  uVar1 = CVmFile::read_uint2(in_RDI);
  this_00 = (CVmFile *)(ulong)uVar1;
  buf_00 = this_00;
  if ((CVmFile *)0x80 < this_00) {
    buf_00 = (CVmFile *)0x80;
  }
  CVmFile::read_bytes(this_00,(char *)buf_00,(size_t)in_RDI);
  if (buf_00 < this_00) {
    CVmFile::get_pos(in_RDI);
    CVmFile::set_pos(in_RDI,in_RDX);
  }
  alloc_ext(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(size_t)this_00);
  return;
}

Assistant:

void CVmObjCharSet::restore_from_file(VMG_ vm_obj_id_t self,
                                      CVmFile *fp, CVmObjFixup *)
{
    char buf[128];
    size_t len;
    size_t read_len;

    /* read the length of the character set name */
    len = fp->read_uint2();

    /* limit the reading to the length of the buffer */
    read_len = len;
    if (read_len > sizeof(buf))
        read_len = sizeof(buf);

    /* read the name, up to the buffer length */
    fp->read_bytes(buf, read_len);

    /* skip any bytes we couldn't fit in the buffer */
    if (len > read_len)
        fp->set_pos(fp->get_pos() + len - read_len);

    /* initialize from the saved data */
    alloc_ext(vmg_ buf, read_len);
}